

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall
despot::Function::Function
          (Function *this,NamedVar *child,
          vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents)

{
  pointer ppNVar1;
  NamedVar *pNVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  this->_vptr_Function = (_func_int **)&PTR__CPT_0019b7e0;
  this->child_ = child;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            (&this->parents_,parents);
  (this->map_).
  super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->map_).
  super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->values_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->map_).
  super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppNVar1 = (parents->super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar5 = 1;
  for (lVar3 = 0;
      (long)(parents->super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3 != lVar3;
      lVar3 = lVar3 + 1) {
    pNVar2 = ppNVar1[lVar3];
    uVar5 = uVar5 * (int)((ulong)((long)*(pointer *)
                                         ((long)&(pNVar2->super_Variable).values_.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         + 8) -
                                 *(long *)&(pNVar2->super_Variable).values_.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data) >> 5);
  }
  if ((ulong)((long)(child->super_Variable).values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(child->super_Variable).values_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0xc80) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&this->values_,(long)(int)uVar5);
    uVar4 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->values_).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + uVar4),
                 (long)(child->super_Variable).values_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(child->super_Variable).values_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
    }
  }
  else {
    std::
    vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
    ::resize(&this->map_,(long)(int)uVar5);
  }
  return;
}

Assistant:

Function::Function(NamedVar* child, vector<NamedVar*> parents) :
	child_(child),
	parents_(parents) {
	int parent_size = 1;
	for (int i = 0; i < parents.size(); i++)
		parent_size *= parents[i]->values().size();

	if (child->values().size() < 100) { // TODO: possible refactoring to use a single data structure
		values_.resize(parent_size);
		for (int i = 0; i < parent_size; i++)
			values_[i].resize(child->values().size());
	} else {
		map_.resize(parent_size);
	}
	// cout << "size " << values_.size() << " " << values_[0].size() << endl;
}